

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiKeyModFlags ImGui::GetMergedKeyModFlags(void)

{
  uint local_14;
  ImGuiKeyModFlags key_mod_flags;
  ImGuiContext *g;
  
  local_14 = (uint)(((GImGui->IO).KeyCtrl & 1U) != 0);
  if (((GImGui->IO).KeyShift & 1U) != 0) {
    local_14 = local_14 | 2;
  }
  if (((GImGui->IO).KeyAlt & 1U) != 0) {
    local_14 = local_14 | 4;
  }
  if (((GImGui->IO).KeySuper & 1U) != 0) {
    local_14 = local_14 | 8;
  }
  return local_14;
}

Assistant:

ImGuiKeyModFlags ImGui::GetMergedKeyModFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiKeyModFlags key_mod_flags = ImGuiKeyModFlags_None;
    if (g.IO.KeyCtrl)   { key_mod_flags |= ImGuiKeyModFlags_Ctrl; }
    if (g.IO.KeyShift)  { key_mod_flags |= ImGuiKeyModFlags_Shift; }
    if (g.IO.KeyAlt)    { key_mod_flags |= ImGuiKeyModFlags_Alt; }
    if (g.IO.KeySuper)  { key_mod_flags |= ImGuiKeyModFlags_Super; }
    return key_mod_flags;
}